

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerTraversalDecoder::DecodeTraversalSymbols
          (MeshEdgebreakerTraversalDecoder *this)

{
  bool bVar1;
  uint64_t *puVar2;
  DecoderBuffer *in_RDI;
  uint64_t traversal_size;
  uint64_t *in_stack_ffffffffffffffe8;
  uint64_t *bytes;
  DecoderBuffer *pDVar3;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  pDVar3 = in_RDI;
  memcpy(in_RDI + 1,in_RDI,0x34);
  bVar1 = DecoderBuffer::StartBitDecoding
                    ((DecoderBuffer *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     SUB81((ulong)pDVar3 >> 0x38,0),in_stack_ffffffffffffffe8);
  if (bVar1) {
    memcpy(in_RDI,in_RDI + 1,0x34);
    bytes = in_stack_ffffffffffffffe8;
    puVar2 = (uint64_t *)DecoderBuffer::remaining_size(in_RDI);
    if (puVar2 < in_stack_ffffffffffffffe8) {
      bVar1 = false;
    }
    else {
      DecoderBuffer::Advance(in_RDI,(int64_t)bytes);
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DecodeTraversalSymbols() {
    uint64_t traversal_size;
    symbol_buffer_ = buffer_;
    if (!symbol_buffer_.StartBitDecoding(true, &traversal_size)) {
      return false;
    }
    buffer_ = symbol_buffer_;
    if (traversal_size > static_cast<uint64_t>(buffer_.remaining_size())) {
      return false;
    }
    buffer_.Advance(traversal_size);
    return true;
  }